

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_round>(Mat *a,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long *in_RDI;
  float fVar3;
  __m128 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_round op;
  Mat *m;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  int local_194;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined4 local_178;
  long local_170;
  undefined4 local_168;
  undefined4 local_164;
  undefined4 local_160;
  undefined4 local_15c;
  undefined4 local_158;
  undefined8 local_150;
  float *local_148;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  int local_128;
  undefined1 local_121 [9];
  long *local_118;
  undefined1 local_10d;
  int local_10c;
  undefined8 *local_100;
  undefined8 *local_f8;
  undefined8 *local_e8;
  float *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  float *local_c8;
  long local_c0;
  undefined4 local_b4;
  long local_b0;
  float *local_a8;
  undefined4 local_9c;
  int local_98;
  int local_94;
  undefined8 *local_90;
  undefined4 local_84;
  long local_80;
  undefined8 *local_70;
  undefined8 *local_48;
  undefined1 *local_40;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  float *local_28;
  undefined1 *local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_128 = *(int *)((long)in_RDI + 0x2c);
  local_12c = (int)in_RDI[6];
  local_130 = *(int *)((long)in_RDI + 0x34);
  local_134 = (int)in_RDI[7];
  local_138 = (int)in_RDI[3];
  local_13c = local_128 * local_12c * local_130 * local_138;
  local_118 = in_RDI;
  for (local_140 = 0; local_140 < local_134; local_140 = local_140 + 1) {
    local_100 = &local_190;
    local_94 = *(int *)((long)local_118 + 0x2c);
    local_98 = (int)local_118[6];
    local_9c = *(undefined4 *)((long)local_118 + 0x34);
    local_a8 = (float *)(*local_118 + local_118[8] * (long)local_140 * local_118[2]);
    local_b0 = local_118[2];
    local_b4 = (undefined4)local_118[3];
    local_c0 = local_118[4];
    local_90 = &local_190;
    local_80 = (long)local_94 * (long)local_98 * local_b0;
    local_f8 = &local_190;
    local_e8 = &local_190;
    local_84 = 0x10;
    local_10c = local_140;
    local_10d = 1;
    local_190 = 0;
    local_180 = 0;
    local_178 = 0;
    local_168 = 0;
    local_164 = 0;
    local_160 = 0;
    local_15c = 0;
    local_158 = 0;
    local_150 = 0;
    local_188 = 0;
    local_148 = local_a8;
    for (local_194 = 0; local_70 = local_e8, local_170 = local_c0, local_194 + 3 < local_13c;
        local_194 = local_194 + 4) {
      local_e0 = local_148;
      uVar1 = *(undefined8 *)local_148;
      uVar2 = *(undefined8 *)(local_148 + 2);
      local_40 = local_121;
      local_48 = &local_1a8;
      local_18._0_4_ = (float)uVar1;
      local_18._4_4_ = (float)((ulong)uVar1 >> 0x20);
      uStack_10._0_4_ = (float)uVar2;
      uStack_10._4_4_ = (float)((ulong)uVar2 >> 0x20);
      local_38 = (int)(float)local_18;
      iStack_34 = (int)local_18._4_4_;
      iStack_30 = (int)(float)uStack_10;
      iStack_2c = (int)uStack_10._4_4_;
      local_1a8 = CONCAT44((float)iStack_34,(float)local_38);
      uStack_1a0 = CONCAT44((float)iStack_2c,(float)iStack_30);
      local_c8 = local_148;
      local_d8 = local_1a8;
      uStack_d0 = uStack_1a0;
      *local_148 = (float)local_38;
      local_148[1] = (float)iStack_34;
      local_148[2] = (float)iStack_30;
      local_148[3] = (float)iStack_2c;
      local_148 = local_148 + 4;
      local_18 = uVar1;
      uStack_10 = uVar2;
    }
    for (; local_194 < local_13c; local_194 = local_194 + 1) {
      local_20 = local_121;
      local_28 = local_148;
      fVar3 = nearbyintf(*local_148);
      *local_148 = fVar3;
      local_148 = local_148 + 1;
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}